

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::ExplicitUniformLocationCaseBase::doRunNegativeLink
          (ExplicitUniformLocationCaseBase *this,
          vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
          *subroutineUniforms)

{
  long lVar1;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  noUniforms;
  string local_58;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  local_38;
  
  local_38.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,0x1aee929);
  lVar1 = doRun(this,&local_38,subroutineUniforms,&local_58,false,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector(&local_38);
  return lVar1;
}

Assistant:

long doRunNegativeLink(std::vector<SubroutineUniform>& subroutineUniforms)
	{
		std::vector<Uniform> noUniforms;
		return doRun(noUniforms, subroutineUniforms, "", false, true);
	}